

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O3

int __thiscall
QTreeWidgetItem::clone
          (QTreeWidgetItem *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  QTreeWidgetItem *other;
  QTreeWidgetItem *pQVar1;
  iterator iVar2;
  iterator iVar3;
  QTreeWidgetItem *this_00;
  ulong uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  QTreeWidgetItem *local_80;
  QArrayData *local_78;
  undefined8 uStack_70;
  long local_68;
  QArrayData *local_58;
  undefined8 uStack_50;
  long local_48;
  QTreeWidgetItem *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 0;
  local_58 = (QArrayData *)0x0;
  uStack_50 = 0;
  local_68 = 0;
  local_78 = (QArrayData *)0x0;
  uStack_70 = 0;
  local_40 = this;
  QtPrivate::QPodArrayOps<QTreeWidgetItem_const*>::emplace<QTreeWidgetItem_const*&>
            ((QPodArrayOps<QTreeWidgetItem_const*> *)&local_58,0,&local_40);
  QList<const_QTreeWidgetItem_*>::end((QList<const_QTreeWidgetItem_*> *)&local_58);
  local_40 = (QTreeWidgetItem *)0x0;
  QtPrivate::QPodArrayOps<QTreeWidgetItem*>::emplace<QTreeWidgetItem*&>
            ((QPodArrayOps<QTreeWidgetItem*> *)&local_78,0,&local_40);
  QList<QTreeWidgetItem_*>::end((QList<QTreeWidgetItem_*> *)&local_78);
  local_80 = (QTreeWidgetItem *)0x0;
  if (local_48 != 0) {
    local_80 = (QTreeWidgetItem *)0x0;
    do {
      iVar2 = QList<const_QTreeWidgetItem_*>::end((QList<const_QTreeWidgetItem_*> *)&local_58);
      other = iVar2.i[-1];
      local_48 = local_48 + -1;
      iVar3 = QList<QTreeWidgetItem_*>::end((QList<QTreeWidgetItem_*> *)&local_78);
      pQVar1 = iVar3.i[-1];
      local_68 = local_68 + -1;
      this_00 = (QTreeWidgetItem *)operator_new(0x60);
      QTreeWidgetItem(this_00,other);
      if (local_80 == (QTreeWidgetItem *)0x0) {
        local_80 = this_00;
      }
      if (pQVar1 != (QTreeWidgetItem *)0x0) {
        this_00->par = pQVar1;
        local_40 = this_00;
        QtPrivate::QPodArrayOps<QTreeWidgetItem*>::emplace<QTreeWidgetItem*&>
                  ((QPodArrayOps<QTreeWidgetItem*> *)&pQVar1->children,0,&local_40);
        QList<QTreeWidgetItem_*>::begin(&pQVar1->children);
      }
      uVar4 = (other->children).d.size;
      if (0 < (int)uVar4) {
        uVar5 = 0;
        do {
          if (uVar5 < uVar4) {
            executePendingSort(other);
            local_40 = (other->children).d.ptr[uVar5];
          }
          else {
            local_40 = (QTreeWidgetItem *)0x0;
          }
          QtPrivate::QPodArrayOps<QTreeWidgetItem_const*>::emplace<QTreeWidgetItem_const*&>
                    ((QPodArrayOps<QTreeWidgetItem_const*> *)&local_58,local_48,&local_40);
          QList<const_QTreeWidgetItem_*>::end((QList<const_QTreeWidgetItem_*> *)&local_58);
          local_40 = this_00;
          QtPrivate::QPodArrayOps<QTreeWidgetItem*>::emplace<QTreeWidgetItem*&>
                    ((QPodArrayOps<QTreeWidgetItem*> *)&local_78,local_68,&local_40);
          QList<QTreeWidgetItem_*>::end((QList<QTreeWidgetItem_*> *)&local_78);
          uVar5 = uVar5 + 1;
          uVar4 = (other->children).d.size;
        } while ((long)uVar5 < (long)(int)uVar4);
      }
    } while (local_48 != 0);
  }
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,8,0x10);
    }
  }
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)local_80;
  }
  __stack_chk_fail();
}

Assistant:

QTreeWidgetItem *QTreeWidgetItem::clone() const
{
    QTreeWidgetItem *copy = nullptr;

    QStack<const QTreeWidgetItem*> stack;
    QStack<QTreeWidgetItem*> parentStack;
    stack.push(this);
    parentStack.push(0);

    QTreeWidgetItem *root = nullptr;
    const QTreeWidgetItem *item = nullptr;
    QTreeWidgetItem *parent = nullptr;
    while (!stack.isEmpty()) {
        // get current item, and copied parent
        item = stack.pop();
        parent = parentStack.pop();

        // copy item
        copy = new QTreeWidgetItem(*item);
        if (!root)
            root = copy;

        // set parent and add to parents children list
        if (parent) {
            copy->par = parent;
            parent->children.insert(0, copy);
        }

        for (int i = 0; i < item->childCount(); ++i) {
            stack.push(item->child(i));
            parentStack.push(copy);
        }
    }
    return root;
}